

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O0

ConstantValue * __thiscall slang::ast::ScriptSession::eval(ScriptSession *this,string_view text)

{
  string_view name;
  string_view text_00;
  bool bVar1;
  element_type *this_00;
  iterator ppVVar2;
  Expression *pEVar3;
  long in_RSI;
  EvalContext *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  MemberSyntax *member;
  iterator __end3_1;
  iterator __begin3_1;
  SyntaxList<slang::syntax::MemberSyntax> *__range3_1;
  Expression *initializer;
  ConstantValue initial;
  VariableSymbol *symbol;
  iterator __end3;
  iterator __begin3;
  SmallVector<slang::ast::VariableSymbol_*,_5UL> *__range3;
  SmallVector<slang::ast::VariableSymbol_*,_5UL> symbols;
  SyntaxNode *node;
  size_t in_stack_fffffffffffffe18;
  Symbol *symbol_00;
  char *in_stack_fffffffffffffe20;
  Expression *in_stack_fffffffffffffe28;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe50;
  SyntaxKind SVar5;
  EvalContext *this_01;
  size_t in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  ExpressionSyntax *in_stack_fffffffffffffea0;
  ScriptSession *in_stack_fffffffffffffea8;
  string_view in_stack_fffffffffffffeb0;
  StatementSyntax *in_stack_fffffffffffffed8;
  ScriptSession *in_stack_fffffffffffffee0;
  iterator local_d0;
  SmallVectorBase<slang::ast::VariableSymbol_*> local_c0 [2];
  SyntaxNode *local_80;
  SmallVectorBase<slang::ast::VariableSymbol_*> *in_stack_ffffffffffffff90;
  undefined7 local_68;
  undefined1 in_stack_ffffffffffffff9f;
  EvalContext *in_stack_ffffffffffffffa0;
  EvalContext *scope;
  Bag local_30;
  
  this_01 = in_RDI;
  bVar4 = sv(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
  symbol_00 = (Symbol *)CONCAT17(in_stack_ffffffffffffff9f,local_68);
  text_00._M_str = in_stack_fffffffffffffe98;
  text_00._M_len = (size_t)in_stack_fffffffffffffe90._M_current;
  name._M_str = in_stack_fffffffffffffe88;
  name._M_len = in_stack_fffffffffffffe80;
  scope = in_stack_ffffffffffffffa0;
  slang::syntax::SyntaxTree::fromText(text_00,&local_30,name,in_stack_fffffffffffffeb0);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
  ::emplace_back<std::shared_ptr<slang::syntax::SyntaxTree>>
            ((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
              *)in_stack_fffffffffffffe30,
             (shared_ptr<slang::syntax::SyntaxTree> *)in_stack_fffffffffffffe28);
  std::shared_ptr<slang::syntax::SyntaxTree>::~shared_ptr
            ((shared_ptr<slang::syntax::SyntaxTree> *)0x4ac634);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::back((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
          *)in_stack_ffffffffffffffa0);
  this_00 = std::
            __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4ac64d);
  local_80 = slang::syntax::SyntaxTree::root(this_00);
  SVar5 = local_80->kind;
  if (SVar5 == CompilationUnit) {
    slang::syntax::SyntaxNode::as<slang::syntax::CompilationUnitSyntax>(local_80);
    std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
              ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)symbol_00);
    std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
              ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
               in_stack_fffffffffffffe28);
    while (bVar1 = __gnu_cxx::
                   operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                             ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                               *)symbol_00), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
      ::operator*((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                   *)&stack0xfffffffffffffe90);
      CompilationUnitSymbol::addMembers((CompilationUnitSymbol *)this_01,(SyntaxNode *)in_RDI);
      __gnu_cxx::
      __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                    *)&stack0xfffffffffffffe90);
    }
    slang::ConstantValue::ConstantValue((ConstantValue *)in_stack_ffffffffffffffa0,symbol_00);
  }
  else if (SVar5 == DataDeclaration) {
    if (local_80->previewNode != (SyntaxNode *)0x0) {
      CompilationUnitSymbol::addMembers((CompilationUnitSymbol *)this_01,(SyntaxNode *)in_RDI);
      Scope::getNameMap((Scope *)in_stack_ffffffffffffffa0);
    }
    SmallVector<slang::ast::VariableSymbol_*,_5UL>::SmallVector
              ((SmallVector<slang::ast::VariableSymbol_*,_5UL> *)0x4ac783);
    slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>(local_80);
    VariableSymbol::fromSyntax
              ((Compilation *)bVar4._M_str,(DataDeclarationSyntax *)bVar4._M_len,(Scope *)scope,
               (bool)in_stack_ffffffffffffff9f,in_stack_ffffffffffffff90);
    local_d0 = SmallVectorBase<slang::ast::VariableSymbol_*>::begin(local_c0);
    ppVVar2 = SmallVectorBase<slang::ast::VariableSymbol_*>::end(local_c0);
    for (; local_d0 != ppVVar2; local_d0 = local_d0 + 1) {
      Scope::addMember((Scope *)in_stack_ffffffffffffffa0,symbol_00);
      slang::ConstantValue::ConstantValue((ConstantValue *)0x4ac85f);
      pEVar3 = ValueSymbol::getInitializer((ValueSymbol *)0x4ac86c);
      if (pEVar3 != (Expression *)0x0) {
        Expression::eval(in_stack_fffffffffffffe28,in_stack_ffffffffffffffa0);
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_ffffffffffffffa0,(ConstantValue *)symbol_00);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x4ac8d0);
      }
      in_stack_fffffffffffffe28 = (Expression *)(in_RSI + 0xce0);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_ffffffffffffffa0,(ConstantValue *)symbol_00);
      EvalContext::createLocal
                (this_01,(ValueSymbol *)in_RDI,
                 (ConstantValue *)CONCAT44(SVar5,in_stack_fffffffffffffe50));
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x4ac95e);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x4ac96b);
    }
    slang::ConstantValue::ConstantValue((ConstantValue *)in_stack_ffffffffffffffa0,symbol_00);
    SmallVector<slang::ast::VariableSymbol_*,_5UL>::~SmallVector
              ((SmallVector<slang::ast::VariableSymbol_*,_5UL> *)0x4ac9d1);
  }
  else if ((((SVar5 == FunctionDeclaration) || (SVar5 == HierarchyInstantiation)) ||
           (SVar5 == InterfaceDeclaration)) ||
          (((SVar5 == ModuleDeclaration || (SVar5 == ParameterDeclarationStatement)) ||
           ((SVar5 == TaskDeclaration || (SVar5 == TypedefDeclaration)))))) {
    CompilationUnitSymbol::addMembers((CompilationUnitSymbol *)this_01,(SyntaxNode *)in_RDI);
    slang::ConstantValue::ConstantValue((ConstantValue *)in_stack_ffffffffffffffa0,symbol_00);
  }
  else {
    if (local_80->previewNode != (SyntaxNode *)0x0) {
      CompilationUnitSymbol::addMembers((CompilationUnitSymbol *)this_01,(SyntaxNode *)in_RDI);
      Scope::getNameMap((Scope *)in_stack_ffffffffffffffa0);
    }
    bVar1 = slang::syntax::ExpressionSyntax::isKind(local_80->kind);
    if (bVar1) {
      slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>(local_80);
      evalExpression(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    }
    else {
      bVar1 = slang::syntax::StatementSyntax::isKind(local_80->kind);
      if (bVar1) {
        slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(local_80);
        evalStatement(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        slang::ConstantValue::ConstantValue((ConstantValue *)in_stack_ffffffffffffffa0,symbol_00);
      }
    }
  }
  return (ConstantValue *)this_01;
}

Assistant:

ConstantValue ScriptSession::eval(std::string_view text) {
    syntaxTrees.emplace_back(SyntaxTree::fromText(text, options));

    const auto& node = syntaxTrees.back()->root();
    switch (node.kind) {
        case SyntaxKind::ParameterDeclarationStatement:
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::TaskDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::HierarchyInstantiation:
        case SyntaxKind::TypedefDeclaration:
            scope.addMembers(node);
            return nullptr;
        case SyntaxKind::DataDeclaration: {
            if (node.previewNode) {
                scope.addMembers(*node.previewNode);
                scope.getNameMap(); // force name map to be built
            }

            SmallVector<VariableSymbol*> symbols;
            VariableSymbol::fromSyntax(compilation, node.as<DataDeclarationSyntax>(), scope,
                                       /* isCheckerFreeVar */ false, symbols);

            for (auto symbol : symbols) {
                scope.addMember(*symbol);

                ConstantValue initial;
                if (auto initializer = symbol->getInitializer())
                    initial = initializer->eval(evalContext);

                evalContext.createLocal(symbol, initial);
            }
            return nullptr;
        }
        case SyntaxKind::CompilationUnit:
            for (auto member : node.as<CompilationUnitSyntax>().members)
                scope.addMembers(*member);
            return nullptr;
        default:
            if (node.previewNode) {
                scope.addMembers(*node.previewNode);
                scope.getNameMap(); // force name map to be built
            }

            if (ExpressionSyntax::isKind(node.kind)) {
                return evalExpression(node.as<ExpressionSyntax>());
            }
            else if (StatementSyntax::isKind(node.kind)) {
                evalStatement(node.as<StatementSyntax>());
                return nullptr;
            }
            else {
                // If this throws, ScriptSession doesn't currently support whatever construct
                // you were trying to evaluate. Add support to the case above.
                SLANG_UNREACHABLE;
            }
    }
}